

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O2

void parser_suite::parse_empty(void)

{
  bool v;
  array<unsigned_char,_0UL> *in_RDX;
  bintoken local_39;
  basic_variable<std::allocator<char>_> result;
  
  trial::protocol::bintoken::parse<std::array<unsigned_char,0ul>,std::allocator<char>>
            (&result,&local_39,in_RDX);
  boost::detail::test_impl
            ("result.same<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x1d,"void parser_suite::parse_empty()",result.storage.current == '\0');
  v = trial::dynamic::basic_variable<std::allocator<char>_>::empty(&result);
  boost::detail::test_impl
            ("result.empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x1e,"void parser_suite::parse_empty()",v);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  return;
}

Assistant:

void parse_empty()
{
    const std::array<value_type, 0> input = {};
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.same<nullable>());
    TRIAL_PROTOCOL_TEST(result.empty());
}